

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O3

void __thiscall
PKCS7Test_KernelModuleSigning_Test::TestBody(PKCS7Test_KernelModuleSigning_Test *this)

{
  PKCS7 *pPVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  char *in_R9;
  pointer *__ptr;
  internal iVar3;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> cert;
  UniquePtr<BIO> data_bio;
  string expected;
  int pkcs7_len;
  UniquePtr<uint8_t> pkcs7_storage;
  uint8_t *pkcs7_bytes;
  UniquePtr<PKCS7> pkcs7;
  UniquePtr<BIO> key_bio;
  UniquePtr<BIO> cert_bio;
  string key_pem;
  string cert_pem;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  AssertHelper local_f0;
  Bytes local_e8;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_b8;
  _Head_base<0UL,_x509_st_*,_false> local_b0;
  _Head_base<0UL,_bio_st_*,_false> local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int local_7c;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  unique_ptr<PKCS7,_bssl::internal::Deleter> local_68;
  __uniq_ptr_impl<bio_st,_bssl::internal::Deleter> local_60;
  __uniq_ptr_impl<bio_st,_bssl::internal::Deleter> local_58;
  string local_50;
  string local_30;
  
  GetTestData_abi_cxx11_(&local_30,"crypto/pkcs7/test/sign_cert.pem");
  GetTestData_abi_cxx11_(&local_50,"crypto/pkcs7/test/sign_key.pem");
  local_58._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       BIO_new_mem_buf(local_30._M_dataplus._M_p,(int)local_30._M_string_length);
  local_b0._M_head_impl =
       (x509_st *)
       PEM_read_bio_X509((BIO *)local_58._M_t.
                                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(X509 **)0x0,
                         (undefined1 *)0x0,(void *)0x0);
  local_60._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       BIO_new_mem_buf(local_50._M_dataplus._M_p,(int)local_50._M_string_length);
  local_b8._M_head_impl =
       (evp_pkey_st *)
       PEM_read_bio_PrivateKey
                 ((BIO *)local_60._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(EVP_PKEY **)0x0,
                  (undefined1 *)0x0,(void *)0x0);
  local_a8._M_head_impl = (bio_st *)BIO_new_mem_buf("signed data",0xb);
  local_68._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.super__Head_base<0UL,_PKCS7_*,_false>.
  _M_head_impl = (__uniq_ptr_data<PKCS7,_bssl::internal::Deleter,_true,_true>)
                 PKCS7_sign((X509 *)local_b0._M_head_impl,(EVP_PKEY *)local_b8._M_head_impl,
                            (stack_st_X509 *)0x0,(BIO *)local_a8._M_head_impl,0x1c2);
  local_d8[0] = (internal)
                ((tuple<PKCS7_*,_bssl::internal::Deleter>)
                 local_68._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl !=
                (_Head_base<0UL,_PKCS7_*,_false>)0x0);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<PKCS7_*,_bssl::internal::Deleter>)
      local_68._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.super__Head_base<0UL,_PKCS7_*,_false>
      ._M_head_impl == (_Head_base<0UL,_PKCS7_*,_false>)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_d0;
    testing::Message::Message((Message *)local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_d8,(AssertionResult *)"pkcs7","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1d7,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_100 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
    pbStack_98 = local_d0;
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00342458;
  }
  else {
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_7c = i2d_PKCS7((PKCS7 *)local_68._M_t.
                                  super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl,
                         (uchar **)&local_70);
    local_d8._0_4_ = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)local_a0,"pkcs7_len","0",&local_7c,(int *)local_d8);
    if (local_a0[0] != (internal)0x0) {
      if (pbStack_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_98,pbStack_98);
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_70._M_head_impl;
      GetTestData_abi_cxx11_((string *)local_a0,"crypto/pkcs7/test/sign_sha256.p7s");
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_7c
      ;
      local_100 = (undefined1  [8])local_70._M_head_impl;
      local_e8.span_.data_ = (uchar *)CONCAT71(local_a0._1_7_,local_a0[0]);
      local_e8.span_.size_ = (size_t)pbStack_98;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_d8,"Bytes(pkcs7_bytes, pkcs7_len)","Bytes(expected)",
                 (Bytes *)local_100,&local_e8);
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_100);
        if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e0,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_100 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_100 + 8))();
        }
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      pPVar1 = PKCS7_sign((X509 *)local_b0._M_head_impl,(EVP_PKEY *)local_b8._M_head_impl,
                          (stack_st_X509 *)0x0,(BIO *)local_a8._M_head_impl,0x182);
      iVar3 = (internal)(pPVar1 == (PKCS7 *)0x0);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_100[0] = iVar3;
      if (!(bool)iVar3) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_100,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x2)",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e5,(char *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_d8._4_4_,local_d8._0_4_),
                          local_c8._M_allocated_capacity + 1);
        }
        if ((long *)local_e8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
        if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,local_f8);
        }
      }
      pPVar1 = PKCS7_sign((X509 *)local_b0._M_head_impl,(EVP_PKEY *)local_b8._M_head_impl,
                          (stack_st_X509 *)0x0,(BIO *)local_a8._M_head_impl,0xc2);
      local_100[0] = (internal)(pPVar1 == (PKCS7 *)0x0);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_100[0]) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_100,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x80 | 0x2 | 0x40)",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e8,(char *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_d8._4_4_,local_d8._0_4_),
                          local_c8._M_allocated_capacity + 1);
        }
        if ((long *)local_e8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
        if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,local_f8);
        }
      }
      pPVar1 = PKCS7_sign((X509 *)local_b0._M_head_impl,(EVP_PKEY *)local_b8._M_head_impl,
                          (stack_st_X509 *)0x0,(BIO *)local_a8._M_head_impl,0x143);
      local_100[0] = (internal)(pPVar1 == (PKCS7 *)0x0);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_100[0]) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_100,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x1 | 0x2 | 0x40)"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1eb,(char *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_d8._4_4_,local_d8._0_4_),
                          local_c8._M_allocated_capacity + 1);
        }
        if ((long *)local_e8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
        if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,local_f8);
        }
      }
      pPVar1 = PKCS7_sign((X509 *)local_b0._M_head_impl,(EVP_PKEY *)local_b8._M_head_impl,
                          (stack_st_X509 *)0x0,(BIO *)local_a8._M_head_impl,0x1c0);
      local_100[0] = (internal)(pPVar1 == (PKCS7 *)0x0);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pPVar1 != (PKCS7 *)0x0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_100,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x40)"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1ee,(char *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_d8._4_4_,local_d8._0_4_),
                          local_c8._M_allocated_capacity + 1);
        }
        if ((long *)local_e8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
        if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,local_f8);
        }
      }
      ERR_clear_error();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_78);
      goto LAB_00342458;
    }
    testing::Message::Message((Message *)local_d8);
    if (pbStack_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_100,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_100);
    if ((long *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8._4_4_,local_d8._0_4_) + 8))();
    }
    if (pbStack_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00342458;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_98;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,pbStack_98);
LAB_00342458:
  std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr(&local_68);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_a8);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_b8);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_60);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_b0);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS7Test, KernelModuleSigning) {
  // Sign a message with the same call that the Linux kernel's sign-file.c
  // makes.
  std::string cert_pem = GetTestData("crypto/pkcs7/test/sign_cert.pem");
  std::string key_pem = GetTestData("crypto/pkcs7/test/sign_key.pem");
  bssl::UniquePtr<BIO> cert_bio(
      BIO_new_mem_buf(cert_pem.data(), cert_pem.size()));
  bssl::UniquePtr<X509> cert(
      PEM_read_bio_X509(cert_bio.get(), nullptr, nullptr, nullptr));

  bssl::UniquePtr<BIO> key_bio(BIO_new_mem_buf(key_pem.data(), key_pem.size()));
  bssl::UniquePtr<EVP_PKEY> key(
      PEM_read_bio_PrivateKey(key_bio.get(), nullptr, nullptr, nullptr));

  static const char kSignedData[] = "signed data";
  bssl::UniquePtr<BIO> data_bio(
      BIO_new_mem_buf(kSignedData, sizeof(kSignedData) - 1));

  bssl::UniquePtr<PKCS7> pkcs7(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  ASSERT_TRUE(pkcs7);

  uint8_t *pkcs7_bytes = nullptr;
  const int pkcs7_len = i2d_PKCS7(pkcs7.get(), &pkcs7_bytes);
  ASSERT_GE(pkcs7_len, 0);
  bssl::UniquePtr<uint8_t> pkcs7_storage(pkcs7_bytes);

  // RSA signatures are deterministic so the output should not change.
  std::string expected = GetTestData("crypto/pkcs7/test/sign_sha256.p7s");
  EXPECT_EQ(Bytes(pkcs7_bytes, pkcs7_len), Bytes(expected));

  // Other option combinations should fail.
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_TEXT | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_DETACHED));

  ERR_clear_error();
}